

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O1

CharString * __thiscall icu_63::CharString::operator=(CharString *this,CharString *src)

{
  char *__src;
  char *pcVar1;
  
  if ((this->buffer).needToRelease != '\0') {
    uprv_free_63((this->buffer).ptr);
  }
  (this->buffer).capacity = (src->buffer).capacity;
  (this->buffer).needToRelease = (src->buffer).needToRelease;
  pcVar1 = (src->buffer).ptr;
  __src = (src->buffer).stackArray;
  if (pcVar1 == __src) {
    pcVar1 = (this->buffer).stackArray;
    (this->buffer).ptr = pcVar1;
    memcpy(pcVar1,__src,(long)(src->buffer).capacity);
  }
  else {
    (this->buffer).ptr = pcVar1;
    (src->buffer).ptr = __src;
    (src->buffer).capacity = 0x28;
    (src->buffer).needToRelease = '\0';
  }
  this->len = src->len;
  src->len = 0;
  return this;
}

Assistant:

CharString& CharString::operator=(CharString&& src) U_NOEXCEPT {
    buffer = std::move(src.buffer);
    len = src.len;
    src.len = 0;  // not strictly necessary because we make no guarantees on the source string
    return *this;
}